

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O1

bool __thiscall
basisu::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  uint64_t *puVar1;
  vector<unsigned_char> *this_00;
  uint n;
  uint32_t uVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar3;
  params *ppVar4;
  color_rgba *pSrc_pixels;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  potential_solution *ppVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong __n;
  ushort uVar24;
  int iVar25;
  int iVar27;
  int iVar28;
  undefined1 auVar26 [16];
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar36 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar40 [16];
  color_rgba block_colors [4];
  uint32_t block_inten_midpoints [3];
  int64_t block_error;
  undefined1 local_b8 [16];
  uint64_t *local_a0;
  undefined4 local_98;
  uint local_94 [3];
  ulong local_88;
  etc1_solution_coordinates *local_80;
  potential_solution *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar13 = check_for_redundant_solution(this,coords);
  if (!bVar13) {
    return false;
  }
  ppVar4 = this->m_pParams;
  if (ppVar4->m_constrain_against_base_color5 == true) {
    iVar14 = (uint)(coords->m_unscaled_color).field_0.m_comps[0] -
             (uint)(ppVar4->m_base_color5).field_0.m_comps[0];
    iVar18 = (uint)(coords->m_unscaled_color).field_0.m_comps[1] -
             (uint)(ppVar4->m_base_color5).field_0.m_comps[1];
    iVar19 = (uint)(coords->m_unscaled_color).field_0.m_comps[2] -
             (uint)(ppVar4->m_base_color5).field_0.m_comps[2];
    iVar30 = iVar18;
    if (iVar14 < iVar18) {
      iVar30 = iVar14;
    }
    if (iVar19 <= iVar30) {
      iVar30 = iVar19;
    }
    if (-5 < iVar30) {
      if (iVar18 < iVar14) {
        iVar18 = iVar14;
      }
      if (iVar18 <= iVar19) {
        iVar18 = iVar19;
      }
      if (iVar18 < 4) goto LAB_0022ddea;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_0022ddea:
    bVar17 = (coords->m_unscaled_color).field_0.m_comps[0];
    if (coords->m_color4 == true) {
      bVar17 = bVar17 << 4 | bVar17;
      uVar24 = *(ushort *)((long)&(coords->m_unscaled_color).field_0 + 1);
      auVar26 = psllw(ZEXT216(uVar24),4);
      uVar24 = auVar26._0_2_ & (ushort)DAT_0027d610 | uVar24;
    }
    else {
      bVar17 = bVar17 << 3 | bVar17 >> 2;
      uVar24 = *(ushort *)((long)&(coords->m_unscaled_color).field_0 + 1);
      auVar26 = psllw(ZEXT216(uVar24),3);
      uVar24 = auVar26._0_2_ & (ushort)DAT_0027d5d0 | uVar24 >> 2 & (ushort)DAT_0027d5e0;
    }
    n = this->m_pParams->m_num_src_pixels;
    __n = (ulong)n;
    if ((trial_solution->m_selectors).m_size != n) {
      __assert_fail("trial_solution.m_selectors.size() == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                    ,0x519,
                    "bool basisu::etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates &, potential_solution &, potential_solution *)"
                   );
    }
    bVar10 = (byte)(uVar24 >> 8);
    bVar11 = (byte)uVar24;
    trial_solution->m_error = 0xffffffffffffffff;
    ppVar4 = this->m_pParams;
    local_78 = pBest_solution;
    local_80 = coords;
    if ((ppVar4->super_basis_etc1_pack_params).m_quality == cETCQualityFast) {
      local_98 = 0;
    }
    else {
      local_98 = (int)CONCAT71((int7)((ulong)ppVar4 >> 8),
                               (ppVar4->super_basis_etc1_pack_params).m_perceptual);
    }
    local_a0 = &trial_solution->m_error;
    local_88 = (ulong)(n - 1);
    local_48._1_3_ = 0;
    local_48[0] = bVar17;
    local_48[4] = bVar17;
    local_48._5_3_ = 0;
    local_48[8] = bVar17;
    local_48._9_3_ = 0;
    local_48[0xc] = bVar17;
    local_48._13_3_ = 0;
    local_58._1_3_ = 0;
    local_58[0] = bVar11;
    local_58[4] = bVar11;
    local_58._5_3_ = 0;
    local_58[8] = bVar11;
    local_58._9_3_ = 0;
    local_58[0xc] = bVar11;
    local_58._13_3_ = 0;
    local_68._1_3_ = 0;
    local_68[0] = bVar10;
    local_68[4] = bVar10;
    local_68._5_3_ = 0;
    local_68[8] = bVar10;
    local_68._9_3_ = 0;
    local_68[0xc] = bVar10;
    local_68._13_3_ = 0;
    lVar23 = 7;
    do {
      lVar15 = lVar23 * 0x10;
      iVar35 = *(int *)(g_etc1_inten_tables + lVar15);
      iVar37 = *(int *)(g_etc1_inten_tables + lVar15 + 4);
      iVar38 = *(int *)(g_etc1_inten_tables + lVar15 + 8);
      iVar39 = *(int *)(g_etc1_inten_tables + lVar15 + 0xc);
      iVar30 = iVar35 + local_48._0_4_;
      iVar18 = iVar37 + local_48._4_4_;
      iVar14 = iVar38 + local_48._8_4_;
      iVar19 = iVar39 + local_48._12_4_;
      iVar25 = iVar35 + local_58._0_4_;
      iVar27 = iVar37 + local_58._4_4_;
      iVar28 = iVar38 + local_58._8_4_;
      iVar29 = iVar39 + local_58._12_4_;
      iVar35 = iVar35 + local_68._0_4_;
      iVar37 = iVar37 + local_68._4_4_;
      iVar38 = iVar38 + local_68._8_4_;
      iVar39 = iVar39 + local_68._12_4_;
      auVar26 = pmovzxbd(in_XMM3,0xffffffff);
      iVar6 = auVar26._0_4_;
      uVar31 = (uint)(iVar6 < iVar30) * iVar6 | (uint)(iVar6 >= iVar30) * iVar30;
      iVar7 = auVar26._4_4_;
      uVar32 = (uint)(iVar7 < iVar18) * iVar7 | (uint)(iVar7 >= iVar18) * iVar18;
      iVar8 = auVar26._8_4_;
      uVar33 = (uint)(iVar8 < iVar14) * iVar8 | (uint)(iVar8 >= iVar14) * iVar14;
      iVar9 = auVar26._12_4_;
      uVar34 = (uint)(iVar9 < iVar19) * iVar9 | (uint)(iVar9 >= iVar19) * iVar19;
      iVar18 = (-1 < (int)uVar31) * uVar31;
      iVar30 = (-1 < (int)uVar32) * uVar32;
      auVar26._4_4_ = iVar30;
      auVar26._0_4_ = iVar18;
      iVar19 = (-1 < (int)uVar33) * uVar33;
      auVar26._8_4_ = iVar19;
      iVar14 = (-1 < (int)uVar34) * uVar34;
      auVar26._12_4_ = iVar14;
      uVar31 = (uint)(iVar6 < iVar25) * iVar6 | (uint)(iVar6 >= iVar25) * iVar25;
      uVar32 = (uint)(iVar7 < iVar27) * iVar7 | (uint)(iVar7 >= iVar27) * iVar27;
      uVar33 = (uint)(iVar8 < iVar28) * iVar8 | (uint)(iVar8 >= iVar28) * iVar28;
      uVar34 = (uint)(iVar9 < iVar29) * iVar9 | (uint)(iVar9 >= iVar29) * iVar29;
      iVar29 = (-1 < (int)uVar31) * uVar31;
      iVar28 = (-1 < (int)uVar32) * uVar32;
      iVar25 = (-1 < (int)uVar33) * uVar33;
      iVar27 = (-1 < (int)uVar34) * uVar34;
      uVar31 = (uint)(iVar6 < iVar35) * iVar6 | (uint)(iVar6 >= iVar35) * iVar35;
      uVar32 = (uint)(iVar7 < iVar37) * iVar7 | (uint)(iVar7 >= iVar37) * iVar37;
      uVar33 = (uint)(iVar8 < iVar38) * iVar8 | (uint)(iVar8 >= iVar38) * iVar38;
      uVar34 = (uint)(iVar9 < iVar39) * iVar9 | (uint)(iVar9 >= iVar39) * iVar39;
      iVar6 = (-1 < (int)uVar31) * uVar31;
      iVar7 = (-1 < (int)uVar32) * uVar32;
      iVar8 = (-1 < (int)uVar33) * uVar33;
      iVar9 = (-1 < (int)uVar34) * uVar34;
      uVar31 = iVar29 + iVar18 + iVar6;
      iVar30 = iVar28 + iVar30 + iVar7;
      iVar18 = iVar25 + iVar19 + iVar8;
      uVar32 = iVar27 + iVar14 + iVar9;
      auVar36._0_4_ = iVar6 * 0x10000;
      auVar36._4_4_ = iVar7 * 0x10000;
      auVar36._8_4_ = iVar8 * 0x10000;
      auVar36._12_4_ = iVar9 * 0x10000;
      auVar40._0_4_ = iVar29 * 0x100;
      auVar40._4_4_ = iVar28 * 0x100;
      auVar40._8_4_ = iVar25 * 0x100;
      auVar40._12_4_ = iVar27 * 0x100;
      in_XMM3 = auVar40 | auVar36 | auVar26 | _DAT_00322170;
      local_b8 = in_XMM3;
      auVar26 = local_b8;
      local_94[0] = iVar30 + uVar31;
      local_94[1] = iVar30 + iVar18;
      local_94[2] = iVar18 + uVar32;
      pSrc_pixels = this->m_pParams->m_pSrc_pixels;
      local_b8[0xc] = in_XMM3[0xc];
      local_b8[0xd] = in_XMM3[0xd];
      local_b8[0xe] = in_XMM3[0xe];
      local_b8 = auVar26;
      if ((char)local_98 == '\0') {
        uVar33 = this->m_pSorted_luma[local_88];
        if (local_94[0] <= uVar33 * 2) {
          uVar31 = *this->m_pSorted_luma;
          if (uVar31 * 2 < local_94[2]) {
            uVar20 = 0;
            if (n == 0) {
              uVar16 = 0;
            }
            else {
              uVar31 = 0;
              uVar16 = 0;
              do {
                uVar33 = this->m_pSorted_luma[uVar20] * 2;
                uVar32 = uVar31 + 1;
                if (uVar32 < 4) {
                  uVar32 = 3;
                }
                do {
                  uVar21 = (ulong)uVar31;
                  uVar34 = local_94[uVar21];
                  if (uVar33 < uVar34) {
                    uVar32 = this->m_pSorted_luma_indices[uVar20];
                    if ((this->m_temp_selectors).m_size <= uVar32) goto LAB_0022e871;
                    (this->m_temp_selectors).m_p[uVar32] = (uchar)uVar31;
                    iVar18 = (uint)(byte)local_b8[uVar21 * 4] -
                             (uint)pSrc_pixels[uVar32].field_0.m_comps[0];
                    iVar14 = (uint)(byte)local_b8[uVar21 * 4 + 1] -
                             (uint)pSrc_pixels[uVar32].field_0.m_comps[1];
                    iVar30 = (uint)(byte)local_b8[uVar21 * 4 + 2] -
                             (uint)pSrc_pixels[uVar32].field_0.m_comps[2];
                    uVar16 = uVar16 + (uint)(iVar30 * iVar30 + iVar14 * iVar14 + iVar18 * iVar18);
                    uVar32 = uVar31;
                    break;
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar32 != uVar31);
                uVar31 = uVar32;
                if (uVar34 <= uVar33) goto LAB_0022e69d;
                uVar20 = uVar20 + 1;
              } while (uVar20 != __n);
              uVar20 = (ulong)n;
            }
LAB_0022e69d:
            iVar30 = n - (uint)uVar20;
            if ((uint)uVar20 <= n && iVar30 != 0) {
              uVar20 = uVar20 & 0xffffffff;
              do {
                uVar31 = this->m_pSorted_luma_indices[uVar20];
                if ((this->m_temp_selectors).m_size <= uVar31) goto LAB_0022e871;
                (this->m_temp_selectors).m_p[uVar31] = '\x03';
                iVar18 = (uint)local_b8[0xc] - (uint)pSrc_pixels[uVar31].field_0.m_comps[0];
                iVar14 = (uint)local_b8[0xd] - (uint)pSrc_pixels[uVar31].field_0.m_comps[1];
                iVar19 = (uint)local_b8[0xe] - (uint)pSrc_pixels[uVar31].field_0.m_comps[2];
                uVar16 = uVar16 + (uint)(iVar19 * iVar19 + iVar14 * iVar14 + iVar18 * iVar18);
                uVar20 = uVar20 + 1;
                iVar30 = iVar30 + -1;
              } while (iVar30 != 0);
            }
          }
          else {
            uVar33 = uVar31 - uVar32;
            if (uVar32 <= uVar31 && uVar33 != 0) {
              uVar31 = -uVar33;
              if (0 < (int)uVar33) {
                uVar31 = uVar33;
              }
              if (*local_a0 <= (ulong)uVar31) goto LAB_0022e4c7;
            }
            if ((this->m_temp_selectors).m_size == 0) goto LAB_0022e871;
            memset((this->m_temp_selectors).m_p,3,__n);
            if (n == 0) goto LAB_0022e4c0;
            uVar20 = 0;
            uVar16 = 0;
            do {
              iVar30 = (uint)local_b8[0xc] - (uint)pSrc_pixels[uVar20].field_0.m_comps[0];
              iVar18 = (uint)local_b8[0xd] - (uint)pSrc_pixels[uVar20].field_0.m_comps[1];
              iVar14 = (uint)local_b8[0xe] - (uint)pSrc_pixels[uVar20].field_0.m_comps[2];
              uVar16 = uVar16 + (uint)(iVar14 * iVar14 + iVar18 * iVar18 + iVar30 * iVar30);
              uVar20 = uVar20 + 1;
              auVar26 = local_b8;
            } while (__n != uVar20);
          }
          goto LAB_0022e70b;
        }
        uVar32 = uVar31 - uVar33;
        if (uVar33 <= uVar31 && uVar32 != 0) {
          uVar31 = -uVar32;
          if (0 < (int)uVar32) {
            uVar31 = uVar32;
          }
          if (*local_a0 <= (ulong)uVar31) goto LAB_0022e4c7;
        }
        if ((this->m_temp_selectors).m_size == 0) goto LAB_0022e871;
        memset((this->m_temp_selectors).m_p,0,__n);
        if (n != 0) {
          uVar20 = 0;
          uVar16 = 0;
          do {
            iVar30 = (uint)(byte)local_b8[0] - (uint)pSrc_pixels[uVar20].field_0.m_comps[0];
            iVar18 = (uint)(byte)local_b8[1] - (uint)pSrc_pixels[uVar20].field_0.m_comps[1];
            iVar14 = (uint)(byte)local_b8[2] - (uint)pSrc_pixels[uVar20].field_0.m_comps[2];
            uVar16 = uVar16 + (uint)(iVar14 * iVar14 + iVar18 * iVar18 + iVar30 * iVar30);
            uVar20 = uVar20 + 1;
            auVar26 = local_b8;
          } while (__n != uVar20);
          goto LAB_0022e70b;
        }
LAB_0022e4c0:
        uVar16 = 0;
        auVar26 = local_b8;
LAB_0022e70b:
        local_b8 = auVar26;
        if (uVar16 < *local_a0) {
          trial_solution->m_error = uVar16;
          (trial_solution->m_coords).m_inten_table = (uint32_t)lVar23;
          puVar5 = (trial_solution->m_selectors).m_p;
          (trial_solution->m_selectors).m_p = (this->m_temp_selectors).m_p;
          (this->m_temp_selectors).m_p = puVar5;
          uVar2 = (trial_solution->m_selectors).m_size;
          (trial_solution->m_selectors).m_size = (this->m_temp_selectors).m_size;
          (this->m_temp_selectors).m_size = uVar2;
          uVar2 = (trial_solution->m_selectors).m_capacity;
          (trial_solution->m_selectors).m_capacity = (this->m_temp_selectors).m_capacity;
          (this->m_temp_selectors).m_capacity = uVar2;
          trial_solution->m_valid = true;
          if (uVar16 == 0) {
            bVar13 = true;
            goto LAB_0022e76b;
          }
        }
        bVar13 = false;
      }
      else {
        uVar33 = this->m_pSorted_luma[local_88];
        if (local_94[0] <= uVar33 * 2) {
          uVar31 = *this->m_pSorted_luma;
          if (uVar31 * 2 < local_94[2]) {
            if (g_cpu_supports_sse41 == '\0') {
              uVar20 = 0;
              uVar16 = 0;
              if (n != 0) {
                uVar31 = 0;
                do {
                  uVar33 = this->m_pSorted_luma[uVar20] * 2;
                  uVar32 = uVar31 + 1;
                  if (uVar32 < 4) {
                    uVar32 = 3;
                  }
                  do {
                    uVar21 = (ulong)uVar31;
                    uVar34 = local_94[uVar21];
                    if (uVar33 < uVar34) {
                      uVar32 = this->m_pSorted_luma_indices[uVar20];
                      if ((this->m_temp_selectors).m_size <= uVar32) goto LAB_0022e871;
                      (this->m_temp_selectors).m_p[uVar32] = (uchar)uVar31;
                      iVar18 = (uint)(byte)local_b8[uVar21 * 4] -
                               (uint)pSrc_pixels[uVar32].field_0.m_comps[0];
                      iVar30 = (uint)(byte)local_b8[uVar21 * 4 + 2] -
                               (uint)pSrc_pixels[uVar32].field_0.m_comps[2];
                      iVar14 = iVar30 * 9 + iVar18 * 0x1b +
                               ((uint)(byte)local_b8[uVar21 * 4 + 1] -
                               (uint)pSrc_pixels[uVar32].field_0.m_comps[1]) * 0x5c;
                      lVar15 = (long)(iVar18 * 0x80 - iVar14);
                      lVar22 = (long)(iVar30 * 0x80 - iVar14);
                      uVar16 = uVar16 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                                         (int)((ulong)((long)iVar14 * (long)iVar14) >> 7) +
                                        ((uint)((int)((ulong)(lVar15 * lVar15) >> 7) * 0x1a) >> 7));
                      uVar32 = uVar31;
                      break;
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar32 != uVar31);
                  uVar31 = uVar32;
                  if (uVar34 <= uVar33) goto LAB_0022e5d8;
                  uVar20 = uVar20 + 1;
                } while (uVar20 != __n);
                uVar20 = (ulong)n;
              }
LAB_0022e5d8:
              iVar30 = n - (uint)uVar20;
              if ((uint)uVar20 <= n && iVar30 != 0) {
                uVar20 = uVar20 & 0xffffffff;
                do {
                  uVar31 = this->m_pSorted_luma_indices[uVar20];
                  if ((this->m_temp_selectors).m_size <= uVar31) goto LAB_0022e871;
                  (this->m_temp_selectors).m_p[uVar31] = '\x03';
                  iVar18 = (uint)local_b8[0xc] - (uint)pSrc_pixels[uVar31].field_0.m_comps[0];
                  iVar14 = (uint)local_b8[0xe] - (uint)pSrc_pixels[uVar31].field_0.m_comps[2];
                  iVar19 = iVar14 * 9 + iVar18 * 0x1b +
                           ((uint)local_b8[0xd] - (uint)pSrc_pixels[uVar31].field_0.m_comps[1]) *
                           0x5c;
                  lVar15 = (long)(iVar18 * 0x80 - iVar19);
                  lVar22 = (long)(iVar14 * 0x80 - iVar19);
                  uVar16 = uVar16 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                                     (int)((ulong)((long)iVar19 * (long)iVar19) >> 7) +
                                    ((uint)((int)((ulong)(lVar15 * lVar15) >> 7) * 0x1a) >> 7));
                  uVar20 = uVar20 + 1;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
            }
            else {
              uVar16 = 0;
              if (n != 0) {
                uVar31 = 0;
                do {
                  uVar33 = this->m_pSorted_luma[uVar16] * 2;
                  uVar32 = uVar31 + 1;
                  if (uVar32 < 4) {
                    uVar32 = 3;
                  }
                  do {
                    uVar34 = local_94[uVar31];
                    if (uVar33 < uVar34) {
                      if ((this->m_temp_selectors).m_size <= this->m_pSorted_luma_indices[uVar16])
                      goto LAB_0022e871;
                      (this->m_temp_selectors).m_p[this->m_pSorted_luma_indices[uVar16]] =
                           (uchar)uVar31;
                      uVar32 = uVar31;
                      break;
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar32 != uVar31);
                  uVar31 = uVar32;
                  if (uVar34 <= uVar33) goto LAB_0022e1f0;
                  uVar16 = uVar16 + 1;
                } while (uVar16 != __n);
                uVar16 = (ulong)n;
              }
LAB_0022e1f0:
              iVar30 = n - (uint)uVar16;
              if ((uint)uVar16 <= n && iVar30 != 0) {
                uVar16 = uVar16 & 0xffffffff;
                do {
                  if ((this->m_temp_selectors).m_size <= this->m_pSorted_luma_indices[uVar16])
                  goto LAB_0022e871;
                  (this->m_temp_selectors).m_p[this->m_pSorted_luma_indices[uVar16]] = '\x03';
                  uVar16 = uVar16 + 1;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if ((this->m_temp_selectors).m_size == 0) goto LAB_0022e871;
              perceptual_distance_rgb_4_N_sse41
                        ((int64_t *)&local_70,(this->m_temp_selectors).m_p,(color_rgba *)local_b8,
                         pSrc_pixels,n,0x7fffffffffffffff);
              uVar16 = local_70;
              auVar26 = local_b8;
            }
          }
          else {
            uVar33 = uVar31 - uVar32;
            if (uVar32 <= uVar31 && uVar33 != 0) {
              uVar31 = -uVar33;
              if (0 < (int)uVar33) {
                uVar31 = uVar33;
              }
              if (*local_a0 <= (ulong)uVar31) goto LAB_0022e4c7;
            }
            if ((this->m_temp_selectors).m_size == 0) goto LAB_0022e871;
            memset((this->m_temp_selectors).m_p,3,__n);
            if (n == 0) goto LAB_0022e4c0;
            uVar20 = 0;
            uVar16 = 0;
            do {
              iVar18 = (uint)local_b8[0xc] - (uint)pSrc_pixels[uVar20].field_0.m_comps[0];
              iVar14 = (uint)local_b8[0xe] - (uint)pSrc_pixels[uVar20].field_0.m_comps[2];
              iVar30 = iVar14 * 9 + iVar18 * 0x1b +
                       ((uint)local_b8[0xd] - (uint)pSrc_pixels[uVar20].field_0.m_comps[1]) * 0x5c;
              lVar15 = (long)(iVar18 * 0x80 - iVar30);
              lVar22 = (long)(iVar14 * 0x80 - iVar30);
              uVar16 = uVar16 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                                 (int)((ulong)((long)iVar30 * (long)iVar30) >> 7) +
                                ((uint)((int)((ulong)(lVar15 * lVar15) >> 7) * 0x1a) >> 7));
              uVar20 = uVar20 + 1;
              auVar26 = local_b8;
            } while (__n != uVar20);
          }
          goto LAB_0022e70b;
        }
        uVar32 = uVar31 - uVar33;
        if (uVar31 < uVar33 || uVar32 == 0) {
LAB_0022dfe1:
          if ((this->m_temp_selectors).m_size == 0) {
LAB_0022e871:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]"
                         );
          }
          memset((this->m_temp_selectors).m_p,0,__n);
          if (n == 0) goto LAB_0022e4c0;
          uVar20 = 0;
          uVar16 = 0;
          do {
            iVar18 = (uint)(byte)local_b8[0] - (uint)pSrc_pixels[uVar20].field_0.m_comps[0];
            iVar14 = (uint)(byte)local_b8[2] - (uint)pSrc_pixels[uVar20].field_0.m_comps[2];
            iVar30 = iVar14 * 9 + iVar18 * 0x1b +
                     ((uint)(byte)local_b8[1] - (uint)pSrc_pixels[uVar20].field_0.m_comps[1]) * 0x5c
            ;
            lVar15 = (long)(iVar18 * 0x80 - iVar30);
            lVar22 = (long)(iVar14 * 0x80 - iVar30);
            uVar16 = uVar16 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                               (int)((ulong)((long)iVar30 * (long)iVar30) >> 7) +
                              ((uint)((int)((ulong)(lVar15 * lVar15) >> 7) * 0x1a) >> 7));
            uVar20 = uVar20 + 1;
            auVar26 = local_b8;
          } while (__n != uVar20);
          goto LAB_0022e70b;
        }
        uVar31 = -uVar32;
        if (0 < (int)uVar32) {
          uVar31 = uVar32;
        }
        if ((ulong)uVar31 < *local_a0) goto LAB_0022dfe1;
LAB_0022e4c7:
        bVar13 = false;
      }
LAB_0022e76b:
      ppVar12 = local_78;
    } while ((!bVar13) && (bVar13 = lVar23 != 0, lVar23 = lVar23 + -1, bVar13));
    aVar3 = (local_80->m_unscaled_color).field_0;
    (trial_solution->m_coords).m_unscaled_color.field_0 = aVar3;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((local_78 != (potential_solution *)0x0) && (*local_a0 < local_78->m_error)) {
      puVar1 = &local_78->m_error;
      (local_78->m_coords).m_unscaled_color.field_0 = aVar3;
      (local_78->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
      (local_78->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
      if (local_78 != trial_solution) {
        this_00 = &local_78->m_selectors;
        if ((local_78->m_selectors).m_capacity < (trial_solution->m_selectors).m_size) {
          if (this_00->m_p != (uchar *)0x0) {
            free(this_00->m_p);
            this_00->m_p = (uchar *)0x0;
            this_00->m_size = 0;
            this_00->m_capacity = 0;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,(trial_solution->m_selectors).m_size,false,1,
                     (object_mover)0x0,false);
        }
        else if ((local_78->m_selectors).m_size != 0) {
          (local_78->m_selectors).m_size = 0;
        }
        if ((this_00->m_p != (uchar *)0x0) &&
           (puVar5 = (trial_solution->m_selectors).m_p, puVar5 != (uchar *)0x0)) {
          memcpy(this_00->m_p,puVar5,(ulong)(trial_solution->m_selectors).m_size);
        }
        (ppVar12->m_selectors).m_size = (trial_solution->m_selectors).m_size;
      }
      ppVar12->m_valid = *(bool *)(local_a0 + 1);
      *puVar1 = *local_a0;
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
	{
		if (!check_for_redundant_solution(coords))
			return false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval solution fast: %u %u %u\n", coords.m_unscaled_color.r, coords.m_unscaled_color.g, coords.m_unscaled_color.b);
#endif

		if (m_pParams->m_constrain_against_base_color5)
		{
			const int dr = (int)coords.m_unscaled_color.r - (int)m_pParams->m_base_color5.r;
			const int dg = (int)coords.m_unscaled_color.g - (int)m_pParams->m_base_color5.g;
			const int db = (int)coords.m_unscaled_color.b - (int)m_pParams->m_base_color5.b;

			if ((minimum(dr, dg, db) < cETC1ColorDeltaMin) || (maximum(dr, dg, db) > cETC1ColorDeltaMax))
			{
				trial_solution.m_valid = false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
				printf("Eval failed due to constraint from %u %u %u\n", m_pParams->m_base_color5.r, m_pParams->m_base_color5.g, m_pParams->m_base_color5.b);
#endif
				return false;
			}
		}

		const color_rgba base_color(coords.get_scaled_color());
		
		const uint32_t n = m_pParams->m_num_src_pixels;
		assert(trial_solution.m_selectors.size() == n);

		trial_solution.m_error = UINT64_MAX;
								
		const bool perceptual = (m_pParams->m_quality == cETCQualityFast) ? false : m_pParams->m_perceptual;
				
		for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
		{
			const int* pInten_table = g_etc1_inten_tables[inten_table];

			uint32_t block_inten[4];
			color_rgba block_colors[4];
			for (uint32_t s = 0; s < 4; s++)
			{
				const int yd = pInten_table[s];
				color_rgba block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 255);
				block_colors[s] = block_color;
				block_inten[s] = block_color.r + block_color.g + block_color.b;
			}

			// evaluate_solution_fast() enforces/assumes a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
			// The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
			// 0   1   2   3
			//   01  12  23
			const uint32_t block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };
															
			uint64_t total_error = 0;
			const color_rgba* pSrc_pixels = m_pParams->m_pSrc_pixels;
						
			if (perceptual)
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					if (!g_cpu_supports_sse41)
					{
						uint32_t cur_selector = 0, c;
						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
								if (++cur_selector > 2)
									goto done;
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
							total_error += color_distance(true, block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
						}
					done:
						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							total_error += color_distance(true, block_colors[3], pSrc_pixels[sorted_pixel_index], false);
							++c;
						}
					}
					else
					{
#if BASISU_SUPPORT_SSE
						uint32_t cur_selector = 0, c;

						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
							{
								if (++cur_selector > 2)
									goto done3;
							}
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						}
					done3:

						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							++c;
						}

						int64_t block_error;
						perceptual_distance_rgb_4_N_sse41(&block_error, &m_temp_selectors[0], block_colors, pSrc_pixels, n, INT64_MAX);
						total_error += block_error;
#endif
					}
				}
			}
			else
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					uint32_t cur_selector = 0, c;
					for (c = 0; c < n; c++)
					{
						const uint32_t y = m_pSorted_luma[c];
						while ((y * 2) >= block_inten_midpoints[cur_selector])
							if (++cur_selector > 2)
								goto done2;
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						total_error += color_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
					}
				done2:
					while (c < n)
					{
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = 3;
						total_error += color_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
						++c;
					}
				}
			}

			if (total_error < trial_solution.m_error)
			{
				trial_solution.m_error = total_error;
				trial_solution.m_coords.m_inten_table = inten_table;
				trial_solution.m_selectors.swap(m_temp_selectors);
				trial_solution.m_valid = true;
				if (!total_error)
					break;
			}
		}
		trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
		trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval done: %u error: %I64u best error so far: %I64u\n", (trial_solution.m_error < pBest_solution->m_error), trial_solution.m_error, pBest_solution->m_error);
#endif

		bool success = false;
		if (pBest_solution)
		{
			if (trial_solution.m_error < pBest_solution->m_error)
			{
				*pBest_solution = trial_solution;
				success = true;
			}
		}

		return success;
	}